

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall
bloaty::RollupOutput::PrettyPrint(RollupOutput *this,OutputOptions *options,ostream *out)

{
  pointer pRVar1;
  RollupRow *child;
  pointer row;
  
  if (options->show != kShowVM) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"    FILE SIZE   ",0x10);
  }
  if (options->show != kShowFile) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"     VM SIZE    ",0x10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  if (options->show != kShowVM) {
    std::__ostream_insert<char,std::char_traits<char>>(out," -------------- ",0x10);
  }
  if (options->show != kShowFile) {
    std::__ostream_insert<char,std::char_traits<char>>(out," -------------- ",0x10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  pRVar1 = (this->toplevel_row_).sorted_children.
           super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (row = (this->toplevel_row_).sorted_children.
             super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
             super__Vector_impl_data._M_start; row != pRVar1; row = row + 1) {
    PrettyPrintTree(this,row,0,options,out);
  }
  PrettyPrintRow(this,&this->toplevel_row_,0,options,out);
  return;
}

Assistant:

void RollupOutput::PrettyPrint(const OutputOptions& options,
                               std::ostream* out) const {
  if (ShowFile(options)) {
    *out << "    FILE SIZE   ";
  }

  if (ShowVM(options)) {
    *out << "     VM SIZE    ";
  }

  *out << "\n";

  if (ShowFile(options)) {
    *out << " -------------- ";
  }

  if (ShowVM(options)) {
    *out << " -------------- ";
  }

  *out << "\n";

  for (const auto& child : toplevel_row_.sorted_children) {
    PrettyPrintTree(child, 0, options, out);
  }

  // The "TOTAL" row comes after all other rows.
  PrettyPrintRow(toplevel_row_, 0, options, out);

  uint64_t file_filtered = 0;
  uint64_t vm_filtered = 0;
  uint64_t filtered = 0;
  if (ShowFile(options)) {
    filtered += toplevel_row_.filtered_size.file;
  }
  if (ShowVM(options)) {
    filtered += toplevel_row_.filtered_size.vm;
  }

  if (vm_filtered == 0 && file_filtered == 0) {
    return;
  }

  *out << "Filtering enabled (source_filter); omitted";

  if (file_filtered > 0 && vm_filtered > 0) {
    *out << " file =" << SiPrint(file_filtered, /*force_sign=*/false)
         << ", vm =" << SiPrint(vm_filtered, /*force_sign=*/false);
  } else if (file_filtered > 0) {
    *out << SiPrint(file_filtered, /*force_sign=*/false);
  } else {
    *out << SiPrint(vm_filtered, /*force_sign=*/false);
  }

  *out << " of entries\n";
}